

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace::~IfcPolygonalBoundedHalfSpace
          (IfcPolygonalBoundedHalfSpace *this)

{
  LazyObject *pLVar1;
  
  this[-1].super_IfcHalfSpaceSolid.AgreementFlag._M_dataplus._M_p = (pointer)0x810288;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x810300;
  this[-1].super_IfcHalfSpaceSolid.AgreementFlag.field_2._M_allocated_capacity = 0x8102b0;
  *(undefined8 *)&this[-1].super_IfcHalfSpaceSolid.field_0x58 = 0x8102d8;
  pLVar1 = this[-1].PolygonalBoundary.obj;
  if (pLVar1 != (LazyObject *)&this[-1].field_0x80) {
    operator_delete(pLVar1,*(long *)&this[-1].field_0x80 + 1);
  }
  operator_delete(&this[-1].super_IfcHalfSpaceSolid.AgreementFlag,0x90);
  return;
}

Assistant:

IfcPolygonalBoundedHalfSpace() : Object("IfcPolygonalBoundedHalfSpace") {}